

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O2

void stl_string_begins_with_string(void)

{
  Constraint_ *pCVar1;
  allocator local_29;
  string bobbob;
  
  std::__cxx11::string::string((string *)&bobbob,"bobbob",&local_29);
  pCVar1 = (Constraint_ *)create_begins_with_string_constraint("bob","\"bob\"");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x66,"bobbob",(string *)&bobbob,pCVar1);
  std::__cxx11::string::~string((string *)&bobbob);
  return;
}

Assistant:

Ensure(stl_string_begins_with_string) {
    std::string bobbob("bobbob");
    assert_that(bobbob, begins_with_string("bob"));
}